

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9MuxProfile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  uint local_40;
  uint local_3c;
  int fVerbose;
  int nLimit;
  int fAdders;
  int fMuxes;
  int fNpn;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  local_3c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar4 = Extra_UtilGetopt(argc,argv,"Nnmavh");
    if (iVar4 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9MuxProfile(): There is no AIG.\n");
        return 1;
      }
      if (bVar1) {
        iVar4 = Gia_ManHasMapping(pAbc->pGia);
        if ((iVar4 == 0) || (iVar4 = Gia_ManLutSizeMax(pAbc->pGia), 3 < iVar4)) {
          Abc_Print(-1,"Abc_CommandAbc9MuxProfile(): Expecting AIG mapped into 3-LUTs.\n");
          return 1;
        }
        Acec_StatsCollect(pAbc->pGia,local_40);
      }
      else if (bVar2) {
        Gia_ManMuxProfiling(pAbc->pGia);
      }
      else if (bVar3) {
        Acec_ManProfile(pAbc->pGia,local_40);
      }
      else {
        Gia_ManProfileStructures(pAbc->pGia,local_3c,local_40);
      }
      return 0;
    }
    switch(iVar4) {
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_00296c3c;
      }
      local_3c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((int)local_3c < 0) {
LAB_00296c3c:
        Abc_Print(-2,"usage: &profile [-N num] [-nmavh]\n");
        Abc_Print(-2,"\t         profile gate structures appearing in the AIG\n");
        Abc_Print(-2,"\t-N num : limit on class size to show [default = %d]\n",(ulong)local_3c);
        pcVar5 = "no";
        if (bVar1) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,
                  "\t-n     : toggle profiling NPN-classes (for 3-LUT mapped AIGs) [default = %s]\n"
                  ,pcVar5);
        pcVar5 = "no";
        if (bVar2) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-m     : toggle profiling MUX structures [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (bVar3) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-a     : toggle profiling adder structures [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (local_40 != 0) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_00296c3c;
    case 0x61:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 0x68:
      goto LAB_00296c3c;
    case 0x6d:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      local_40 = local_40 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9MuxProfile( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManMuxProfiling( Gia_Man_t * p );
    extern void Gia_ManProfileStructures( Gia_Man_t * p, int nLimit, int fVerbose );
    extern void Acec_StatsCollect( Gia_Man_t * p, int fVerbose );
    extern void Acec_ManProfile( Gia_Man_t * p, int fVerbose );
    int c, fNpn = 0, fMuxes = 0, fAdders = 0, nLimit = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nnmavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLimit < 0 )
                goto usage;
            break;
        case 'n':
            fNpn ^= 1;
            break;
        case 'm':
            fMuxes ^= 1;
            break;
        case 'a':
            fAdders ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MuxProfile(): There is no AIG.\n" );
        return 1;
    }
    if ( fNpn )
    {
        if ( !Gia_ManHasMapping(pAbc->pGia) || Gia_ManLutSizeMax(pAbc->pGia) >= 4 )
        {
            Abc_Print( -1, "Abc_CommandAbc9MuxProfile(): Expecting AIG mapped into 3-LUTs.\n" );
            return 1;
        }
        Acec_StatsCollect( pAbc->pGia, fVerbose );
    }
    else if ( fMuxes )
        Gia_ManMuxProfiling( pAbc->pGia );
    else if ( fAdders )
        Acec_ManProfile( pAbc->pGia, fVerbose );
    else
        Gia_ManProfileStructures( pAbc->pGia, nLimit, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &profile [-N num] [-nmavh]\n" );
    Abc_Print( -2, "\t         profile gate structures appearing in the AIG\n" );
    Abc_Print( -2, "\t-N num : limit on class size to show [default = %d]\n", nLimit );
    Abc_Print( -2, "\t-n     : toggle profiling NPN-classes (for 3-LUT mapped AIGs) [default = %s]\n", fNpn? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle profiling MUX structures [default = %s]\n", fMuxes? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle profiling adder structures [default = %s]\n", fAdders? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}